

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rldata.cpp
# Opt level: O0

string * __thiscall
relive::Track::reLiveURL_abi_cxx11_(string *__return_storage_ptr__,Track *this,int64_t offset)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  int64_t val;
  int64_t val_00;
  int64_t val_01;
  relive *local_140;
  allocator<char> local_111;
  string local_110;
  string local_f0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  relive *local_20;
  int64_t offset_local;
  Track *this_local;
  
  local_20 = (relive *)offset;
  offset_local = (int64_t)this;
  this_local = (Track *)__return_storage_ptr__;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_stream);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<relive::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<relive::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_stream);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar2->_station);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<relive::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<relive::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_stream);
      peVar3 = std::__shared_ptr_access<relive::Station,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<relive::Station,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar2->_station);
      base62Encode_abi_cxx11_(&local_c0,(relive *)peVar3->_reliveId,val);
      std::operator+(&local_a0,"track-",&local_c0);
      std::operator+(&local_80,&local_a0,"-");
      peVar2 = std::__shared_ptr_access<relive::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<relive::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_stream);
      base62Encode_abi_cxx11_(&local_f0,(relive *)peVar2->_reliveId,val_00);
      std::operator+(&local_60,&local_80,&local_f0);
      std::operator+(&local_40,&local_60,"-");
      if (local_20 == (relive *)0x0) {
        local_140 = (relive *)this->_time;
      }
      else {
        local_140 = local_20;
      }
      base62Encode_abi_cxx11_(&local_110,local_140,val_01);
      std::operator+(__return_storage_ptr__,&local_40,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      return __return_storage_ptr__;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_111)
  ;
  std::allocator<char>::~allocator(&local_111);
  return __return_storage_ptr__;
}

Assistant:

std::string Track::reLiveURL(int64_t offset) const
{
    if(_stream && _stream->_station) {
        return "track-" + base62Encode(_stream->_station->_reliveId) + "-" + base62Encode(_stream->_reliveId) + "-" + base62Encode(offset ? offset : _time);
    }
    return "";
}